

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O0

TPZEigenSolver<std::complex<double>_> * __thiscall
TPZEigenAnalysis::EigenSolver<std::complex<double>>(TPZEigenAnalysis *this)

{
  long in_RDI;
  TPZEigenSolver<std::complex<double>_> *tmp;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  TPZEigenSolver<std::complex<double>_> *local_28;
  
  if (*(long *)(in_RDI + 0x170) == 0) {
    local_28 = (TPZEigenSolver<std::complex<double>_> *)0x0;
  }
  else {
    local_28 = (TPZEigenSolver<std::complex<double>_> *)
               __dynamic_cast(*(long *)(in_RDI + 0x170),&TPZSolver::typeinfo,
                              &TPZEigenSolver<std::complex<double>>::typeinfo,0);
  }
  if ((*(long *)(in_RDI + 0x170) != 0) && (local_28 == (TPZEigenSolver<std::complex<double>_> *)0x0)
     ) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver() [TVar = std::complex<double>]"
                   );
    std::operator<<((ostream *)&std::cerr," incompatible Solver type! Aborting\n");
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  return local_28;
}

Assistant:

TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver()
{
    const auto tmp = dynamic_cast<TPZEigenSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}